

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

QtFontStyle * bestStyle(QtFontFoundry *foundry,Key *styleKey,QString *styleName)

{
  int iVar1;
  QtFontStyle **ppQVar2;
  QtFontStyle *pQVar3;
  ushort uVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  long in_RCX;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  QStringView QVar15;
  QStringView QVar16;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = foundry->count;
  uVar10 = 0;
  if ((long)iVar1 < 1) {
    uVar11 = 0xffff;
  }
  else {
    uVar12 = (uint)styleKey;
    ppQVar2 = foundry->styles;
    uVar11 = 0xffff;
    uVar14 = 0;
    do {
      pQVar3 = ppQVar2[uVar14];
      if (((in_RCX != 0) && ((pQVar3->styleName).d.size == in_RCX)) &&
         (QVar15.m_data = (storage_type_conflict *)styleName, QVar15.m_size = in_RCX,
         QVar16.m_data = (pQVar3->styleName).d.ptr, QVar16.m_size = in_RCX,
         cVar5 = QtPrivate::equalStrings(QVar15,QVar16), cVar5 != '\0')) {
        uVar11 = 0;
        iVar9 = (int)uVar14;
        break;
      }
      uVar6 = (uint)*(uint3 *)&pQVar3->key;
      uVar4 = (short)(((ushort)((ulong)styleKey >> 2) & 0x3ff) -
                     (*(ushort *)&pQVar3->key >> 2 & 0x3ff)) / 10;
      uVar8 = -uVar4;
      if (0 < (short)uVar4) {
        uVar8 = uVar4;
      }
      uVar7 = (uint)uVar8;
      if ((0xfff < (uVar12 & 0xffffff)) && (0xfff < uVar6)) {
        iVar13 = ((int)(uVar12 << 8) >> 0x14) - ((int)(uVar6 << 8) >> 0x14);
        iVar9 = -iVar13;
        if (0 < iVar13) {
          iVar9 = iVar13;
        }
        uVar7 = (uint)uVar8 + iVar9;
      }
      if ((uVar12 & 3) != (uVar6 & 3)) {
        if ((((ulong)styleKey & 3) == 0) || ((*(uint3 *)&pQVar3->key & 3) == 0)) {
          uVar7 = uVar7 + 0x1000;
        }
        else {
          uVar7 = uVar7 + 1;
        }
      }
      if ((int)uVar7 < (int)uVar11) {
        uVar10 = uVar14 & 0xffffffff;
        uVar11 = uVar7;
      }
      iVar9 = (int)uVar10;
      uVar14 = uVar14 + 1;
    } while ((long)iVar1 != uVar14);
    uVar10 = (ulong)iVar9;
  }
  QtPrivateLogging::lcFontMatch();
  if (((byte)QtPrivateLogging::lcFontMatch::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_40 = QtPrivateLogging::lcFontMatch::category.name;
    QMessageLogger::debug(local_58,"          best style has distance 0x%x",(ulong)uVar11);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return foundry->styles[uVar10];
  }
  __stack_chk_fail();
}

Assistant:

static QtFontStyle *bestStyle(QtFontFoundry *foundry, const QtFontStyle::Key &styleKey,
                              const QString &styleName = QString())
{
    int best = 0;
    int dist = 0xffff;

    for ( int i = 0; i < foundry->count; i++ ) {
        QtFontStyle *style = foundry->styles[i];

        if (!styleName.isEmpty() && styleName == style->styleName) {
            dist = 0;
            best = i;
            break;
        }

        int d = qAbs( (int(styleKey.weight) - int(style->key.weight)) / 10 );

        if ( styleKey.stretch != 0 && style->key.stretch != 0 ) {
            d += qAbs( styleKey.stretch - style->key.stretch );
        }

        if (styleKey.style != style->key.style) {
            if (styleKey.style != QFont::StyleNormal && style->key.style != QFont::StyleNormal)
                // one is italic, the other oblique
                d += 0x0001;
            else
                d += 0x1000;
        }

        if ( d < dist ) {
            best = i;
            dist = d;
        }
    }

    qCDebug(lcFontMatch,  "          best style has distance 0x%x", dist );
    return foundry->styles[best];
}